

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

stb_dirtree2 * stb_dirtree2_from_files_relative(char *src,char **filelist,int count)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  stb_dirtree2 *p;
  char *pcVar5;
  stb_dirtree2 *psVar6;
  stb_dirtree2 **ppsVar7;
  char *pcVar8;
  char **filelist_00;
  char **ppcVar9;
  char **ppcVar10;
  char **ppcVar11;
  ulong uVar12;
  char **files;
  char *local_850;
  char **descendents;
  char **local_840;
  char buffer1 [1024];
  char buffer2 [1024];
  
  local_850 = src;
  local_840 = filelist;
  sVar2 = strlen(src);
  descendents = (char **)0x0;
  files = (char **)0x0;
  ppcVar11 = (char **)0x0;
  if (count != 0) {
    ppcVar10 = (char **)(ulong)(uint)count;
    if (count < 1) {
      ppcVar10 = ppcVar11;
    }
    filelist_00 = (char **)0x0;
    for (ppcVar9 = (char **)0x0; iVar1 = (int)sVar2, ppcVar10 != ppcVar9;
        ppcVar9 = (char **)((long)ppcVar9 + 1)) {
      pcVar8 = local_840[(long)ppcVar9];
      iVar1 = stb_dir_is_prefix(local_850,iVar1,pcVar8);
      if (iVar1 != 0) {
        if ((filelist_00 == (char **)0x0) ||
           (*(int *)((long)filelist_00 + -0xc) <= *(int *)(filelist_00 + -2))) {
          stb__arr_addlen_(&descendents,8,1);
          filelist_00 = descendents;
        }
        else {
          *(int *)(filelist_00 + -2) = *(int *)(filelist_00 + -2) + 1;
          filelist_00 = ppcVar11;
        }
        if (filelist_00 == (char **)0x0) {
          lVar3 = 0;
        }
        else {
          lVar3 = (long)*(int *)(filelist_00 + -2);
        }
        filelist_00[lVar3 + -1] = pcVar8;
        ppcVar11 = filelist_00;
      }
    }
    if (filelist_00 != (char **)0x0) {
      if (iVar1 == 0) {
        uVar12 = (ulong)(**filelist_00 == '\\' || **filelist_00 == '/');
      }
      else {
        uVar12 = (ulong)(iVar1 + 1);
      }
      iVar1 = *(int *)(filelist_00 + -2);
      lVar3 = 0;
      do {
        lVar3 = (long)(int)lVar3;
        while( true ) {
          if (iVar1 <= (int)lVar3) {
            p = (stb_dirtree2 *)malloc(0x28);
            p->files = files;
            p->subdirs = (stb_dirtree2 **)0x0;
            pcVar4 = strdup(local_850);
            p->fullpath = pcVar4;
            pcVar5 = stb_strrchr2(pcVar4,'/','\\');
            pcVar8 = pcVar5 + 1;
            if (pcVar5 == (char *)0x0) {
              pcVar8 = pcVar4;
            }
            p->relpath = pcVar8;
            stb__strcmpoffset = 0;
            qsort(filelist_00,(long)iVar1,8,stb__qsort_stricmp);
            buffer1[0] = '\0';
            lVar3 = 0;
            while( true ) {
              if (*(int *)(filelist_00 + -2) <= lVar3) {
                if (p->subdirs == (stb_dirtree2 **)0x0) {
                  iVar1 = 0;
                }
                else {
                  iVar1 = *(int *)(p->subdirs + -2);
                }
                p->num_subdir = iVar1;
                p->weight = 0.0;
                return p;
              }
              pcVar8 = filelist_00[lVar3];
              pcVar4 = stb_strchr2(pcVar8 + uVar12,'/','\\');
              if (pcVar4 == (char *)0x0) break;
              stb_strncpy(buffer2,pcVar8,((int)pcVar4 - (int)pcVar8) + 1);
              iVar1 = strcasecmp(buffer1,buffer2);
              if (iVar1 != 0) {
                psVar6 = stb_dirtree2_from_files_relative
                                   (buffer2,filelist_00,*(int *)(filelist_00 + -2));
                if (psVar6 == (stb_dirtree2 *)0x0) {
                  __assert_fail("t != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                                ,0x1824,
                                "stb_dirtree2 *stb_dirtree2_from_files_relative(char *, char **, int)"
                               );
                }
                strcpy(buffer1,buffer2);
                ppsVar7 = p->subdirs;
                if ((ppsVar7 == (stb_dirtree2 **)0x0) ||
                   (*(int *)((long)ppsVar7 + -0xc) <= *(int *)(ppsVar7 + -2))) {
                  stb__arr_addlen_((void **)p,8,1);
                  ppsVar7 = p->subdirs;
                }
                else {
                  *(int *)(ppsVar7 + -2) = *(int *)(ppsVar7 + -2) + 1;
                }
                ppsVar7[(long)*(int *)(ppsVar7 + -2) + -1] = psVar6;
              }
              lVar3 = lVar3 + 1;
            }
            __assert_fail("t",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                          ,0x1820,
                          "stb_dirtree2 *stb_dirtree2_from_files_relative(char *, char **, int)");
          }
          pcVar8 = filelist_00[lVar3];
          pcVar4 = stb_strchr2(pcVar8 + uVar12,'/','\\');
          if (pcVar4 == (char *)0x0) break;
          lVar3 = lVar3 + 1;
        }
        if ((files == (char **)0x0) || (*(int *)((long)files + -0xc) <= *(int *)(files + -2))) {
          stb__arr_addlen_(&files,8,1);
        }
        else {
          *(int *)(files + -2) = *(int *)(files + -2) + 1;
        }
        files[(long)*(int *)(files + -2) + -1] = pcVar8;
        iVar1 = *(int *)(filelist_00 + -2);
        filelist_00[lVar3] = filelist_00[(long)iVar1 + -1];
        iVar1 = iVar1 + -1;
        *(int *)(filelist_00 + -2) = iVar1;
      } while( true );
    }
  }
  return (stb_dirtree2 *)0x0;
}

Assistant:

stb_dirtree2 *stb_dirtree2_from_files_relative(char *src, char **filelist, int count)
{
   char buffer1[1024];
   int i;
   int dlen = strlen(src), elen;
   stb_dirtree2 *d;
   char ** descendents = NULL;
   char ** files = NULL;
   char *s;
   if (!count) return NULL;
   // first find all the ones that belong here... note this is will take O(NM) with N files and M subdirs
   for (i=0; i < count; ++i) {
      if (stb_dir_is_prefix(src, dlen, filelist[i])) {
         stb_arr_push(descendents, filelist[i]);
      }
   }
   if (descendents == NULL)
      return NULL;
   elen = dlen;
   // skip a leading slash
   if (elen == 0 && (descendents[0][0] == '/' || descendents[0][0] == '\\'))
      ++elen;
   else if (elen)
      ++elen;
   // now extract all the ones that have their root here
   for (i=0; i < stb_arr_len(descendents);) {
      if (!stb_strchr2(descendents[i]+elen, '/', '\\')) {
         stb_arr_push(files, descendents[i]);
         descendents[i] = descendents[stb_arr_len(descendents)-1];
         stb_arr_pop(descendents);
      } else
         ++i;
   }
   // now create a record
   d = (stb_dirtree2 *) malloc(sizeof(*d));
   d->files = files;
   d->subdirs = NULL;
   d->fullpath = strdup(src);
   s = stb_strrchr2(d->fullpath, '/', '\\');
   if (s)
      ++s;
   else
      s = d->fullpath;
   d->relpath = s;
   // now create the children
   qsort(descendents, stb_arr_len(descendents), sizeof(char *), stb_qsort_stricmp(0));
   buffer1[0] = 0;
   for (i=0; i < stb_arr_len(descendents); ++i) {
      char buffer2[1024];
      char *s = descendents[i] + elen, *t;
      t = stb_strchr2(s, '/', '\\');
      assert(t);
      stb_strncpy(buffer2, descendents[i], t-descendents[i]+1);
      if (stb_stricmp(buffer1, buffer2)) {
         stb_dirtree2 *t = stb_dirtree2_from_files_relative(buffer2, descendents, stb_arr_len(descendents));
         assert(t != NULL);
         strcpy(buffer1, buffer2);
         stb_arr_push(d->subdirs, t);
      }
   }
   d->num_subdir = stb_arr_len(d->subdirs);
   d->weight = 0;
   return d;
}